

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parse.cpp
# Opt level: O2

bool parse_instruction(context *ctx,opcode *op)

{
  pointer pp_Var1;
  bool bVar2;
  uint uVar3;
  uint uVar4;
  uint64_t uVar5;
  bool bVar6;
  bool bVar7;
  bool bVar8;
  bool bVar9;
  uint32_t uVar10;
  anon_union_4_2_f99a8bb9_for_sched aVar11;
  _Head_base<0UL,_char_*,_false> __p;
  token_type tVar12;
  int iVar13;
  int iVar14;
  uint uVar15;
  token_predicate extraout_RAX;
  unique_ptr<char[],_std::default_delete<char[]>_> uVar16;
  long lVar17;
  char *pcVar18;
  token_type tVar19;
  context *pcVar20;
  uint uVar21;
  pointer pp_Var22;
  error message_2;
  _Head_base<0UL,_char_*,_false> local_1e8;
  int local_1e0;
  error message_1;
  token_predicate tStack_1d0;
  char *pcStack_1c0;
  error error_message;
  uint local_1a4;
  undefined1 local_1a0 [8];
  token token_1;
  uint local_160;
  int iStack_15c;
  token token;
  opcode saved_op;
  context saved_context;
  
  context::tokenize(&token,ctx);
  tVar12 = token.type;
  if (token.type == none) {
LAB_0011e48c:
    return tVar12 != none;
  }
  while ((token.type == identifier && (*token.data.string._M_str == '.'))) {
    context::parse_option(ctx,&token);
  }
  if ((ctx->pc & 0x1fU) == 0) {
    ctx->pc = ctx->pc | 8;
  }
  if (token.type == at) {
    context::tokenize((token *)&saved_context,ctx);
    token.column = saved_context.line;
    token.data.predicate.negated = saved_context.filename._4_4_;
    token.data.predicate.index = (int)saved_context.filename;
    token.data.string._M_str = saved_context.text_begin;
    token._24_8_ = saved_context.text;
    token.filename = (char *)saved_context.pc;
    tVar19 = (token_type)&token;
    confirm_type((token *)&saved_context,tVar19);
    if (saved_context.pc != 0) {
      error::raise((error *)&saved_context,tVar19);
    }
    std::unique_ptr<char[],_std::default_delete<char[]>_>::~unique_ptr
              ((unique_ptr<char[],_std::default_delete<char[]>_> *)&saved_context);
    opcode::add_bits(op,((ulong)(token.data.predicate.negated != 0) << 3 |
                        (long)token.data.predicate.index) << 0x10);
    saved_context.pc = 0;
    std::unique_ptr<char[],_std::default_delete<char[]>_>::~unique_ptr
              ((unique_ptr<char[],_std::default_delete<char[]>_> *)&saved_context);
    context::tokenize((token *)&saved_context,ctx);
    token.column = saved_context.line;
    token.data.string._M_str = saved_context.text_begin;
    token._24_8_ = saved_context.text;
    token.filename = (char *)saved_context.pc;
    token.data.predicate.negated = saved_context.filename._4_4_;
    token.data.predicate.index = (int)saved_context.filename;
  }
  else {
    opcode::add_bits(op,0x70000);
  }
  if (token.type != identifier) {
    fatal_error(&token,"expected mnemonic");
  }
  pcVar20 = ctx;
  context::context(&saved_context,ctx);
  uVar5 = op->value;
  uVar10 = op->reuse;
  aVar11 = op->sched;
  error_message.message._M_t.super___uniq_ptr_impl<char,_std::default_delete<char[]>_>._M_t.
  super__Tuple_impl<0UL,_char_*,_std::default_delete<char[]>_>.super__Head_base<0UL,_char_*,_false>.
  _M_head_impl = (unique_ptr<char[],_std::default_delete<char[]>_>)
                 (__uniq_ptr_data<char,_std::default_delete<char[]>,_true,_true>)0x0;
  local_1a0._4_4_ = -1;
  lVar17 = 0;
LAB_0011de01:
  if (lVar17 == 0x109) {
    if (error_message.message._M_t.super___uniq_ptr_impl<char,_std::default_delete<char[]>_>._M_t.
        super__Tuple_impl<0UL,_char_*,_std::default_delete<char[]>_>.
        super__Head_base<0UL,_char_*,_false>._M_head_impl ==
        (__uniq_ptr_data<char,_std::default_delete<char[]>,_true,_true>)0x0) {
      fatal_error(&token,"unknown mnemonic \x1b[1m%.*s\x1b[0m",token.data.string._M_len,
                  token.data.string._M_str);
    }
    error::raise(&error_message,(int)pcVar20);
  }
  pcVar18 = table[lVar17].mnemonic;
  pcVar20 = (context *)pcVar18;
  iVar13 = equal(&token,pcVar18);
  if (iVar13 != 0) {
    opcode::add_bits(op,table[lVar17].opcode);
    _local_160 = context::tokenize(&token_1,ctx);
    if (((table[lVar17].flags & 1) == 0) ||
       (local_160 = ~(uint)op->value, iStack_15c = 0, (local_160 & 0x70000) == 0)) {
      pp_Var1 = table[lVar17].operands.
                super__Vector_base<error_(*)(context_&,_token_&,_opcode_&),_std::allocator<error_(*)(context_&,_token_&,_opcode_&)>_>
                ._M_impl.super__Vector_impl_data._M_finish;
      iVar13 = 0x3e9;
      for (pp_Var22 = table[lVar17].operands.
                      super__Vector_base<error_(*)(context_&,_token_&,_opcode_&),_std::allocator<error_(*)(context_&,_token_&,_opcode_&)>_>
                      ._M_impl.super__Vector_impl_data._M_start; pp_Var22 != pp_Var1;
          pp_Var22 = pp_Var22 + 1) {
        (**pp_Var22)((context *)&message_1,(token *)ctx,(opcode *)&token_1);
        if (message_1.message._M_t.super___uniq_ptr_impl<char,_std::default_delete<char[]>_>._M_t.
            super__Tuple_impl<0UL,_char_*,_std::default_delete<char[]>_>.
            super__Head_base<0UL,_char_*,_false>._M_head_impl !=
            (__uniq_ptr_data<char,_std::default_delete<char[]>,_true,_true>)0x0) {
          local_1e8._M_head_impl =
               (char *)message_1.message._M_t.
                       super___uniq_ptr_impl<char,_std::default_delete<char[]>_>._M_t.
                       super__Tuple_impl<0UL,_char_*,_std::default_delete<char[]>_>.
                       super__Head_base<0UL,_char_*,_false>._M_head_impl;
          local_1e0 = iVar13 + -1000;
          goto LAB_0011e38c;
        }
        std::unique_ptr<char[],_std::default_delete<char[]>_>::~unique_ptr
                  ((unique_ptr<char[],_std::default_delete<char[]>_> *)&message_1);
        iVar13 = iVar13 + 1;
        _local_160 = extraout_RAX;
      }
      bVar9 = false;
      bVar8 = false;
      bVar7 = false;
      bVar6 = false;
      uVar21 = 0;
LAB_0011deec:
      do {
        tVar19 = (token_type)&token_1;
        if (token_1.type != at) goto LAB_0011e296;
        context::tokenize((token *)&message_1,ctx);
        token_1._24_8_ = pcStack_1c0;
        token_1.filename =
             (char *)message_1.message._M_t.
                     super___uniq_ptr_impl<char,_std::default_delete<char[]>_>._M_t.
                     super__Tuple_impl<0UL,_char_*,_std::default_delete<char[]>_>.
                     super__Head_base<0UL,_char_*,_false>._M_head_impl;
        iVar14 = equal(&token_1,"WAIT");
        if (iVar14 == 0) {
          iVar14 = equal(&token_1,"WB");
          if ((iVar14 == 0) && (iVar14 = equal(&token_1,"RB"), iVar14 == 0)) {
            iVar14 = equal(&token_1,"Y");
            if ((iVar14 == 0) && (iVar14 = equal(&token_1,"YIELD"), iVar14 == 0)) {
              iVar14 = equal(&token_1,"DEP");
              if (iVar14 == 0) {
                pcVar18 = "expected @WAIT, @WB, @RB, @DEP, or @YIELD/@Y";
              }
              else {
                context::tokenize((token *)&message_1,ctx);
                token_1._24_8_ = pcStack_1c0;
                token_1.filename =
                     (char *)message_1.message._M_t.
                             super___uniq_ptr_impl<char,_std::default_delete<char[]>_>._M_t.
                             super__Tuple_impl<0UL,_char_*,_std::default_delete<char[]>_>.
                             super__Head_base<0UL,_char_*,_false>._M_head_impl;
                token_1.data.predicate = tStack_1d0;
                confirm_type((token *)&message_2,tVar19);
                uVar16._M_t.super___uniq_ptr_impl<char,_std::default_delete<char[]>_>._M_t.
                super__Tuple_impl<0UL,_char_*,_std::default_delete<char[]>_>.
                super__Head_base<0UL,_char_*,_false>._M_head_impl =
                     (__uniq_ptr_data<char,_std::default_delete<char[]>,_true,_true>)
                     (__uniq_ptr_data<char,_std::default_delete<char[]>,_true,_true>)message_2;
                if (message_2.message._M_t.super___uniq_ptr_impl<char,_std::default_delete<char[]>_>
                    ._M_t.super__Tuple_impl<0UL,_char_*,_std::default_delete<char[]>_>.
                    super__Head_base<0UL,_char_*,_false>._M_head_impl !=
                    (__uniq_ptr_data<char,_std::default_delete<char[]>,_true,_true>)0x0)
                goto LAB_0011e348;
                std::unique_ptr<char[],_std::default_delete<char[]>_>::~unique_ptr
                          (&message_2.message);
                if (token_1.data.string._M_len < 6) {
                  if ((uVar21 >> (token_1.data.predicate.index & 0x1fU) & 1) == 0) {
                    context::tokenize((token *)&message_1,ctx);
                    uVar21 = uVar21 | 1 << ((byte)token_1.data.string._M_len & 0x1f);
                    uVar3 = local_1a4;
                    goto LAB_0011e03d;
                  }
                  fail((token *)&message_2,(char *)&token_1,
                       "dependency barrier index %d already specified");
                  goto LAB_0011e33e;
                }
                pcVar18 = "dependency barrier index must be between 0 and 5 inclusively";
              }
            }
            else {
              if (!bVar6) {
                context::tokenize((token *)&message_1,ctx);
                token_1._24_8_ = pcStack_1c0;
                token_1.filename =
                     (char *)message_1.message._M_t.
                             super___uniq_ptr_impl<char,_std::default_delete<char[]>_>._M_t.
                             super__Tuple_impl<0UL,_char_*,_std::default_delete<char[]>_>.
                             super__Head_base<0UL,_char_*,_false>._M_head_impl;
                bVar6 = true;
                goto LAB_0011deec;
              }
              pcVar18 = "yield already specified";
            }
LAB_0011e317:
            fail((token *)&message_2,(char *)&token_1,pcVar18);
          }
          else {
            iVar14 = equal(&token_1,"WB");
            bVar2 = bVar8;
            if (iVar14 == 0) {
              bVar2 = bVar9;
            }
            if (!bVar2) {
              context::tokenize((token *)&message_1,ctx);
              token_1._24_8_ = pcStack_1c0;
              token_1.filename =
                   (char *)message_1.message._M_t.
                           super___uniq_ptr_impl<char,_std::default_delete<char[]>_>._M_t.
                           super__Tuple_impl<0UL,_char_*,_std::default_delete<char[]>_>.
                           super__Head_base<0UL,_char_*,_false>._M_head_impl;
              token_1.data.predicate = tStack_1d0;
              confirm_type((token *)&message_2,tVar19);
              uVar16._M_t.super___uniq_ptr_impl<char,_std::default_delete<char[]>_>._M_t.
              super__Tuple_impl<0UL,_char_*,_std::default_delete<char[]>_>.
              super__Head_base<0UL,_char_*,_false>._M_head_impl =
                   (__uniq_ptr_data<char,_std::default_delete<char[]>,_true,_true>)
                   (__uniq_ptr_data<char,_std::default_delete<char[]>,_true,_true>)message_2;
              if (message_2.message._M_t.super___uniq_ptr_impl<char,_std::default_delete<char[]>_>.
                  _M_t.super__Tuple_impl<0UL,_char_*,_std::default_delete<char[]>_>.
                  super__Head_base<0UL,_char_*,_false>._M_head_impl !=
                  (__uniq_ptr_data<char,_std::default_delete<char[]>,_true,_true>)0x0)
              goto LAB_0011e348;
              std::unique_ptr<char[],_std::default_delete<char[]>_>::~unique_ptr(&message_2.message)
              ;
              if (5 < token_1.data.string._M_len) {
                pcVar18 = "barrier index must be between 0 and 5 inclusively";
                goto LAB_0011e317;
              }
              context::tokenize((token *)&message_1,ctx);
              if (iVar14 != 0) {
                bVar8 = true;
              }
              uVar3 = token_1.data.predicate.index;
              if (iVar14 == 0) {
                bVar9 = true;
                uVar3 = local_1a4;
                local_1a0._0_4_ = token_1.data.predicate.index;
              }
LAB_0011e03d:
              local_1a4 = uVar3;
              token_1.filename =
                   (char *)message_1.message._M_t.
                           super___uniq_ptr_impl<char,_std::default_delete<char[]>_>._M_t.
                           super__Tuple_impl<0UL,_char_*,_std::default_delete<char[]>_>.
                           super__Head_base<0UL,_char_*,_false>._M_head_impl;
              token_1._24_8_ = pcStack_1c0;
              goto LAB_0011deec;
            }
            pcVar18 = "write";
            if (iVar14 == 0) {
              pcVar18 = "read";
            }
            fail((token *)&message_2,(char *)&token_1,"%s barrier already specified",pcVar18);
          }
LAB_0011e33e:
          uVar16._M_t.super___uniq_ptr_impl<char,_std::default_delete<char[]>_>._M_t.
          super__Tuple_impl<0UL,_char_*,_std::default_delete<char[]>_>.
          super__Head_base<0UL,_char_*,_false>._M_head_impl =
               (__uniq_ptr_data<char,_std::default_delete<char[]>,_true,_true>)
               (__uniq_ptr_data<char,_std::default_delete<char[]>,_true,_true>)
               message_2.message._M_t.super___uniq_ptr_impl<char,_std::default_delete<char[]>_>._M_t
               .super__Tuple_impl<0UL,_char_*,_std::default_delete<char[]>_>.
               super__Head_base<0UL,_char_*,_false>._M_head_impl;
          if (message_2.message._M_t.super___uniq_ptr_impl<char,_std::default_delete<char[]>_>._M_t.
              super__Tuple_impl<0UL,_char_*,_std::default_delete<char[]>_>.
              super__Head_base<0UL,_char_*,_false>._M_head_impl ==
              (__uniq_ptr_data<char,_std::default_delete<char[]>,_true,_true>)0x0)
          goto LAB_0011e35f;
LAB_0011e348:
          message_2.message._M_t.super___uniq_ptr_impl<char,_std::default_delete<char[]>_>._M_t.
          super__Tuple_impl<0UL,_char_*,_std::default_delete<char[]>_>.
          super__Head_base<0UL,_char_*,_false>._M_head_impl =
               (unique_ptr<char[],_std::default_delete<char[]>_>)
               (__uniq_ptr_data<char,_std::default_delete<char[]>,_true,_true>)0x0;
          pcVar20 = (context *)&message_2;
          local_1e8._M_head_impl =
               (char *)uVar16._M_t.super___uniq_ptr_impl<char,_std::default_delete<char[]>_>._M_t.
                       super__Tuple_impl<0UL,_char_*,_std::default_delete<char[]>_>.
                       super__Head_base<0UL,_char_*,_false>._M_head_impl;
          local_1e0 = iVar13;
          goto LAB_0011e38f;
        }
        if (bVar7) {
          pcVar18 = "clocks to stall are already specified";
          goto LAB_0011e317;
        }
        context::tokenize((token *)&message_1,ctx);
        token_1._24_8_ = pcStack_1c0;
        token_1.filename =
             (char *)message_1.message._M_t.
                     super___uniq_ptr_impl<char,_std::default_delete<char[]>_>._M_t.
                     super__Tuple_impl<0UL,_char_*,_std::default_delete<char[]>_>.
                     super__Head_base<0UL,_char_*,_false>._M_head_impl;
        token_1.data.predicate = tStack_1d0;
        confirm_type((token *)&message_2,tVar19);
        uVar16._M_t.super___uniq_ptr_impl<char,_std::default_delete<char[]>_>._M_t.
        super__Tuple_impl<0UL,_char_*,_std::default_delete<char[]>_>.
        super__Head_base<0UL,_char_*,_false>._M_head_impl =
             (__uniq_ptr_data<char,_std::default_delete<char[]>,_true,_true>)
             (__uniq_ptr_data<char,_std::default_delete<char[]>,_true,_true>)message_2;
        if (message_2.message._M_t.super___uniq_ptr_impl<char,_std::default_delete<char[]>_>._M_t.
            super__Tuple_impl<0UL,_char_*,_std::default_delete<char[]>_>.
            super__Head_base<0UL,_char_*,_false>._M_head_impl !=
            (__uniq_ptr_data<char,_std::default_delete<char[]>,_true,_true>)0x0) goto LAB_0011e348;
        std::unique_ptr<char[],_std::default_delete<char[]>_>::~unique_ptr(&message_2.message);
        local_160 = token_1.data._0_4_;
        iStack_15c = token_1.data._4_4_;
        if (0xf < token_1.data.string._M_len) {
          pcVar18 = "number of waited clocks must be between 0 and 15 inclusively";
          goto LAB_0011e317;
        }
        context::tokenize((token *)&message_1,ctx);
        token_1._24_8_ = pcStack_1c0;
        token_1.filename =
             (char *)message_1.message._M_t.
                     super___uniq_ptr_impl<char,_std::default_delete<char[]>_>._M_t.
                     super__Tuple_impl<0UL,_char_*,_std::default_delete<char[]>_>.
                     super__Head_base<0UL,_char_*,_false>._M_head_impl;
        bVar7 = true;
      } while( true );
    }
    fail((token *)&message_1,(char *)&token_1,"%s does not support predicated execution",pcVar18);
    local_1e8._M_head_impl =
         (char *)message_1.message._M_t.super___uniq_ptr_impl<char,_std::default_delete<char[]>_>.
                 _M_t.super__Tuple_impl<0UL,_char_*,_std::default_delete<char[]>_>.
                 super__Head_base<0UL,_char_*,_false>._M_head_impl;
    local_1e0 = 0;
    goto LAB_0011e38c;
  }
  goto LAB_0011e3ee;
LAB_0011e296:
  uVar3 = (uint)_local_160 & 0xf;
  if (!bVar7) {
    uVar3 = 0;
  }
  uVar15 = (local_1a4 & 7) << 5;
  if (!bVar8) {
    uVar15 = 0xe0;
  }
  uVar4 = (local_1a0._0_4_ & 7) << 8;
  if (!bVar9) {
    uVar4 = 0x700;
  }
  (op->sched).raw = uVar4 | uVar15 | uVar3 | (uint)(byte)(bVar6 << 4) | (uVar21 & 0x3f) << 0xb;
  message_2.message._M_t.super___uniq_ptr_impl<char,_std::default_delete<char[]>_>._M_t.
  super__Tuple_impl<0UL,_char_*,_std::default_delete<char[]>_>.super__Head_base<0UL,_char_*,_false>.
  _M_head_impl = (unique_ptr<char[],_std::default_delete<char[]>_>)
                 (__uniq_ptr_data<char,_std::default_delete<char[]>,_true,_true>)0x0;
LAB_0011e35f:
  std::unique_ptr<char[],_std::default_delete<char[]>_>::~unique_ptr(&message_2.message);
  confirm_type((token *)&message_1,tVar19);
  local_1e8._M_head_impl =
       (char *)message_1.message._M_t.super___uniq_ptr_impl<char,_std::default_delete<char[]>_>._M_t
               .super__Tuple_impl<0UL,_char_*,_std::default_delete<char[]>_>.
               super__Head_base<0UL,_char_*,_false>._M_head_impl;
  local_1e0 = iVar13;
LAB_0011e38c:
  message_1.message._M_t.super___uniq_ptr_impl<char,_std::default_delete<char[]>_>._M_t.
  super__Tuple_impl<0UL,_char_*,_std::default_delete<char[]>_>.super__Head_base<0UL,_char_*,_false>.
  _M_head_impl = (unique_ptr<char[],_std::default_delete<char[]>_>)
                 (__uniq_ptr_data<char,_std::default_delete<char[]>,_true,_true>)0x0;
  pcVar20 = (context *)&message_1;
LAB_0011e38f:
  std::unique_ptr<char[],_std::default_delete<char[]>_>::~unique_ptr
            ((unique_ptr<char[],_std::default_delete<char[]>_> *)pcVar20);
  __p._M_head_impl = local_1e8._M_head_impl;
  if ((_Tuple_impl<0UL,_char_*,_std::default_delete<char[]>_>)local_1e8._M_head_impl == (char *)0x0)
  {
    ctx->pc = ctx->pc + 8;
    std::unique_ptr<char[],_std::default_delete<char[]>_>::~unique_ptr
              ((unique_ptr<char[],_std::default_delete<char[]>_> *)&local_1e8);
    std::unique_ptr<char[],_std::default_delete<char[]>_>::~unique_ptr(&error_message.message);
    context::~context(&saved_context);
    goto LAB_0011e48c;
  }
  if ((int)local_1a0._4_4_ < local_1e0) {
    local_1e8._M_head_impl = (char *)0x0;
    std::__uniq_ptr_impl<char,_std::default_delete<char[]>_>::reset
              ((__uniq_ptr_impl<char,_std::default_delete<char[]>_> *)&error_message,
               __p._M_head_impl);
    local_1a0._4_4_ = local_1e0;
  }
  pcVar20 = &saved_context;
  context::operator=(ctx,pcVar20);
  op->value = uVar5;
  op->reuse = uVar10;
  op->sched = aVar11;
  std::unique_ptr<char[],_std::default_delete<char[]>_>::~unique_ptr
            ((unique_ptr<char[],_std::default_delete<char[]>_> *)&local_1e8);
LAB_0011e3ee:
  lVar17 = lVar17 + 1;
  goto LAB_0011de01;
}

Assistant:

bool parse_instruction(context& ctx, opcode& op)
{
    token token = ctx.tokenize();
    if (token.type == token_type::none) {
        return false;
    }
    while (token.type == token_type::identifier && token.data.string[0] == '.') {
        ctx.parse_option(token);
    }
    if (ctx.pc % 0x20 == 0) {
        ctx.pc += 8;
    }
    if (token.type == token_type::at) {
        token = ctx.tokenize();
        if (error message = assemble_predicate(token, op, 16, 1); message) {
            message.raise();
        }
        token = ctx.tokenize();
    } else {
        // write always execute by default
        op.add_bits(7ULL << 16);
    }
    if (token.type != token_type::identifier) {
        fatal_error(token, "expected mnemonic");
    }
    const context saved_context = ctx;
    const opcode saved_op = op;
    error error_message;
    int error_score = -1;

    const size_t num_insns = sizeof(table) / sizeof(table[0]);
    for (size_t i = 0; i < num_insns; ++i) {
        const insn& insn = table[i];
        if (!equal(token, insn.mnemonic)) {
            continue;
        }
        auto [insn_error, score] = parse_insn(ctx, op, insn);
        if (!insn_error) {
            // successfully decoded instruction
            ctx.pc += 8;
            return true;
        }
        if (score > error_score) {
            error_message = std::move(insn_error);
            error_score = score;
        }
        // failure, restore context
        ctx = saved_context;
        op = saved_op;
    }
    if (error_message) {
        error_message.raise();
    } else {
        fatal_error(token, "unknown mnemonic \33[1m%.*s\33[0m", std::size(token.data.string),
                    std::data(token.data.string));
    }
}